

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::internal::
CmpHelperEQ<std::tuple<int,int,int,int,int,int,int,int,int,int>,std::tuple<int,int,int,int,int,int,int,int,int,int>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *expected,
          tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *actual)

{
  bool bVar1;
  tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *v;
  tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *v_00;
  string sStack_68;
  string local_48;
  
  bVar1 = std::
          __tuple_compare<std::tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int>,_std::tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int>,_0UL,_10UL>
          ::__eq(expected,(tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *)actual_str);
  if (bVar1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    PrintToString<std::tuple<int,int,int,int,int,int,int,int,int,int>>
              (&local_48,(iutest *)actual_str,v);
    PrintToString<std::tuple<int,int,int,int,int,int,int,int,int,int>>
              (&sStack_68,(iutest *)expected,v_00);
    EqFailure(__return_storage_ptr__,(char *)this,expected_str,&local_48,&sStack_68,false);
    std::__cxx11::string::~string((string *)&sStack_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }